

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O3

int sigfiddle_doinit(t_sigfiddle *x,long npoints,long npitch,long npeakanal,long npeakout)

{
  t_float *ptVar1;
  t_histopeak **pptVar2;
  int iVar3;
  ulong uVar4;
  t_peakout *__s;
  t_float *ptVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar4 = 0x14;
  if (npeakout != 0 || npeakanal != 0) {
    uVar4 = npeakanal;
  }
  uVar9 = 100;
  if (uVar4 < 100) {
    uVar9 = uVar4;
  }
  uVar10 = 0;
  if ((long)uVar4 < 0) {
    uVar9 = uVar10;
  }
  uVar4 = 100;
  if ((ulong)npeakout < 100) {
    uVar4 = npeakout;
  }
  if (npeakout < 0) {
    uVar4 = uVar10;
  }
  uVar8 = 3;
  if ((ulong)npitch < 3) {
    uVar8 = npitch;
  }
  if (npitch < 1) {
    uVar8 = uVar10;
  }
  lVar6 = 0x400;
  if (npoints != 0) {
    lVar6 = npoints;
  }
  iVar3 = sigfiddle_setnpoints(x,(float)lVar6);
  if (iVar3 != 0) {
    __s = (t_peakout *)getbytes(uVar4 * 8);
    if (__s != (t_peakout *)0x0) {
      if (uVar4 != 0) {
        memset(__s,0,uVar4 * 8);
      }
      x->x_peakbuf = __s;
      x->x_npeakout = (int)uVar4;
      x->x_npeakanal = (int)uVar9;
      x->x_phase = 0;
      x->x_histphase = 0;
      x->x_sr = 44100.0;
      ptVar5 = x->x_hist[0].h_pitches;
      lVar6 = 0;
      do {
        x->x_hist[lVar6].h_noted = 0.0;
        x->x_hist[lVar6].h_age = 0;
        x->x_hist[lVar6].h_pitch = 0.0;
        pptVar2 = &x->x_hist[lVar6].h_wherefrom;
        *pptVar2 = (t_histopeak *)0x0;
        pptVar2[1] = (t_histopeak *)0x0;
        lVar7 = -0x14;
        do {
          ptVar1 = ptVar5 + lVar7 + 0x14;
          ptVar1[0] = 0.0;
          ptVar1[1] = 0.0;
          ptVar1[2] = 0.0;
          ptVar1[3] = 0.0;
          ptVar1 = ptVar5 + lVar7;
          ptVar1[0] = 0.0;
          ptVar1[1] = 0.0;
          ptVar1[2] = 0.0;
          ptVar1[3] = 0.0;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0);
        lVar6 = lVar6 + 1;
        ptVar5 = ptVar5 + 0x30;
      } while (lVar6 != 3);
      x->x_nprint = 0;
      iVar3 = (int)uVar8;
      if (uVar8 == 0 && uVar9 != 0) {
        iVar3 = 1;
      }
      x->x_npitch = iVar3;
      x->x_dbs[0] = 0.0;
      x->x_dbs[1] = 0.0;
      x->x_dbs[2] = 0.0;
      x->x_dbs[3] = 0.0;
      x->x_dbs[4] = 0.0;
      x->x_dbs[5] = 0.0;
      x->x_dbs[6] = 0.0;
      x->x_dbs[7] = 0.0;
      x->x_dbs[8] = 0.0;
      x->x_dbs[9] = 0.0;
      x->x_dbs[10] = 0.0;
      x->x_dbs[0xb] = 0.0;
      x->x_dbs[0xc] = 0.0;
      x->x_dbs[0xd] = 0.0;
      x->x_dbs[0xe] = 0.0;
      x->x_dbs[0xf] = 0.0;
      x->x_dbs[0x10] = 0.0;
      x->x_dbs[0x11] = 0.0;
      x->x_dbs[0x12] = 0.0;
      x->x_dbs[0x13] = 0.0;
      x->x_peaked = 0.0;
      x->x_dbage = 0;
      x->x_auto = 1;
      x->x_amplo = 40.0;
      x->x_amphi = 50.0;
      x->x_attacktime = 100;
      x->x_attackbins = 1;
      x->x_attackthresh = 10.0;
      x->x_vibtime = 0x32;
      x->x_vibbins = 1;
      x->x_vibdepth = 0.5;
      x->x_npartial = 7.0;
      x->x_attackvalue = 0;
      return 1;
    }
    sigfiddle_freebird(x);
  }
  pd_error((void *)0x0,"fiddle~: out of memory");
  return 0;
}

Assistant:

int sigfiddle_doinit(t_sigfiddle *x, long npoints, long npitch,
    long npeakanal, long npeakout)
{
    t_float *buf1, *buf2,  *buf3;
    t_peakout *buf4;
    int i;

    if (!npeakanal && !npeakout) npeakanal = DEFNPEAK, npeakout = 0;
    if (npeakanal < 0) npeakanal = 0;
    else if (npeakanal > MAXPEAK) npeakanal = MAXPEAK;
    if (npeakout < 0) npeakout = 0;
    else if (npeakout > MAXPEAK) npeakout = MAXPEAK;
    if (npitch <= 0) npitch = 0;
    else if (npitch > MAXNPITCH) npitch = MAXNPITCH;
    if (npeakanal && !npitch) npitch = 1;
    if (!npoints)
        npoints = DEFAULTPOINTS;
    if (!sigfiddle_setnpoints(x, npoints))
    {
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    if (!(buf4 = (t_peakout *)getbytes(sizeof(*buf4) * npeakout)))
    {
        sigfiddle_freebird(x);
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    for (i = 0; i < npeakout; i++)
        buf4[i].po_freq = buf4[i].po_amp = 0;
    x->x_peakbuf = buf4;

    x->x_npeakout = (int)npeakout;
    x->x_npeakanal = (int)npeakanal;
    x->x_phase = 0;
    x->x_histphase = 0;
    x->x_sr = 44100;            /* this and the next are filled in later */
    for (i = 0; i < MAXNPITCH; i++)
    {
        int j;
        x->x_hist[i].h_pitch = x->x_hist[i].h_noted = 0;
        x->x_hist[i].h_age = 0;
        x->x_hist[i].h_wherefrom = 0;
        x->x_hist[i].h_outlet = 0;
        for (j = 0; j < HISTORY; j++)
            x->x_hist[i].h_amps[j] = x->x_hist[i].h_pitches[j] = 0;
    }
    x->x_nprint = 0;
    x->x_npitch = (int)npitch;
    for (i = 0; i < HISTORY; i++) x->x_dbs[i] = 0;
    x->x_dbage = 0;
    x->x_peaked = 0;
    x->x_auto = 1;
    x->x_amplo = DEFAMPLO;
    x->x_amphi = DEFAMPHI;
    x->x_attacktime = DEFATTACKTIME;
    x->x_attackbins = 1;                /* real value calculated afterward */
    x->x_attackthresh = DEFATTACKTHRESH;
    x->x_vibtime = DEFVIBTIME;
    x->x_vibbins = 1;                   /* real value calculated afterward */
    x->x_vibdepth = DEFVIBDEPTH;
    x->x_npartial = 7;
    x->x_attackvalue = 0;
    return (1);
}